

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O2

void __thiscall Screen_Manager::Remove(Screen_Manager *this,Screen_Info *screen)

{
  __fd_mask *p_Var1;
  Screen_Info *pSVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  Screen_Info *pSVar7;
  
  if (this->head == screen) {
    pSVar7 = (Screen_Info *)0x0;
    if (screen->next != screen) {
      pSVar7 = screen->next;
    }
    this->head = pSVar7;
  }
  iVar4 = XConnectionNumber(screen->dpy);
  bVar3 = (byte)iVar4 & 0x3f;
  p_Var1 = (this->read_flag).fds_bits + iVar4 / 0x40;
  *p_Var1 = *p_Var1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
  uVar6 = (ulong)(uint)this->nfds;
  while (0 < (int)uVar6) {
    uVar5 = (int)uVar6 - 1;
    uVar6 = (ulong)uVar5;
    if (((ulong)(this->read_flag).fds_bits[uVar5 >> 6] >> (uVar6 & 0x3f) & 1) != 0) break;
    this->nfds = uVar5;
  }
  pSVar7 = screen->next;
  pSVar2 = screen->prev;
  pSVar7->prev = pSVar2;
  pSVar2->next = pSVar7;
  Screen_Info::~Screen_Info(screen);
  operator_delete(screen);
  return;
}

Assistant:

void
Screen_Manager::Remove(Screen_Manager::Screen_Info *screen)
{
  if (head == screen)
    head = (screen->next == screen) ? nullptr : screen->next;

  int fd = XConnectionNumber(screen->dpy);
  FD_CLR(fd, &read_flag);
  while (nfds > 0 && !FD_ISSET(nfds - 1, &read_flag))
    --nfds;

  screen->next->prev = screen->prev;
  screen->prev->next = screen->next;
  delete screen;
}